

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::
SmallVectorBase<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
::
emplace_back<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
          (SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
           *this,span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>
                 *args)

{
  iterator psVar1;
  undefined8 *in_RSI;
  SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
  *in_RDI;
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>
  *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
  *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
    ::end(in_RDI);
    local_8 = emplaceRealloc<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    psVar1 = SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
             ::end(in_RDI);
    psVar1->_M_ptr = (pointer)*in_RSI;
    (psVar1->_M_extent)._M_extent_value = in_RSI[1];
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
              ::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }